

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseWheelEvent(ImGuiIO *this,float wheel_x,float wheel_y)

{
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  float wheel_y_local;
  float wheel_x_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO == this) {
    if (((((wheel_x != 0.0) || (NAN(wheel_x))) || (wheel_y != 0.0)) || (NAN(wheel_y))) &&
       ((this->AppAcceptingEvents & 1U) != 0)) {
      ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
      local_38._0_4_ = ImGuiInputEventType_MouseWheel;
      local_38._4_4_ = ImGuiInputSource_Mouse;
      e.Type = (ImGuiInputEventType)wheel_x;
      e.Source = (ImGuiInputSource)wheel_y;
      ImVector<ImGuiInputEvent>::push_back
                ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x37d8),(ImGuiInputEvent *)local_38);
    }
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x56d,"void ImGuiIO::AddMouseWheelEvent(float, float)");
}

Assistant:

void ImGuiIO::AddMouseWheelEvent(float wheel_x, float wheel_y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if ((wheel_x == 0.0f && wheel_y == 0.0f) || !AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseWheel;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseWheel.WheelX = wheel_x;
    e.MouseWheel.WheelY = wheel_y;
    g.InputEventsQueue.push_back(e);
}